

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void StyleToHead(TidyDocImpl *doc,Node *head,Node *node,Bool fix,int indent)

{
  Node *node_00;
  Stack *stack_00;
  Node *next;
  Stack *stack;
  int indent_local;
  Bool fix_local;
  Node *node_local;
  Node *head_local;
  TidyDocImpl *doc_local;
  
  stack_00 = prvTidynewStack(doc,0x10);
  _indent_local = node;
  do {
    while( true ) {
      if (_indent_local == (Node *)0x0) {
        prvTidyfreeStack(stack_00);
        return;
      }
      node_00 = _indent_local->next;
      if (((_indent_local == (Node *)0x0) || (_indent_local->tag == (Dict *)0x0)) ||
         (_indent_local->tag->id != TidyTag_STYLE)) break;
      if (fix == no) {
        prvTidyReport(doc,_indent_local,head,0x241);
      }
      else {
        prvTidyRemoveNode(_indent_local);
        prvTidyInsertNodeAtEnd(head,_indent_local);
        prvTidyReport(doc,_indent_local,head,0x263);
      }
LAB_0015c867:
      _indent_local = node_00;
      if (node_00 == (Node *)0x0) {
        _indent_local = prvTidypop(stack_00);
      }
    }
    if (_indent_local->content == (Node *)0x0) goto LAB_0015c867;
    prvTidypush(stack_00,node_00);
    _indent_local = _indent_local->content;
  } while( true );
}

Assistant:

static void StyleToHead(TidyDocImpl* doc, Node *head, Node *node, Bool fix, int indent)
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node *next;
    
    while (node)
    {
        next = node->next;
        
        if (nodeIsSTYLE(node))
        {
            if (fix)
            {
                TY_(RemoveNode)(node); /* unhook style node from body */
                TY_(InsertNodeAtEnd)(head, node);   /* add to end of head */
                TY_(Report)(doc, node, head, MOVED_STYLE_TO_HEAD); /* report move */
            }
            else
            {
                TY_(Report)(doc, node, head, FOUND_STYLE_IN_BODY);
            }
        }
        else if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            indent++;
            continue;
        }
        
        if (next)
            node = next;
        else
        {
            node = TY_(pop)(stack);
            indent--;
        }
    }
    TY_(freeStack)(stack);
}